

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldDataPdu.cpp
# Opt level: O0

void __thiscall DIS::MinefieldDataPdu::MinefieldDataPdu(MinefieldDataPdu *this)

{
  MinefieldDataPdu *this_local;
  
  MinefieldFamilyPdu::MinefieldFamilyPdu(&this->super_MinefieldFamilyPdu);
  (this->super_MinefieldFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__MinefieldDataPdu_00272778;
  EntityID::EntityID(&this->_minefieldID);
  EntityID::EntityID(&this->_requestingEntityID);
  this->_minefieldSequenceNumbeer = 0;
  this->_requestID = '\0';
  this->_pduSequenceNumber = '\0';
  this->_numberOfPdus = '\0';
  this->_numberOfMinesInThisPdu = '\0';
  this->_numberOfSensorTypes = '\0';
  this->_pad2 = '\0';
  this->_dataFilter = 0;
  EntityType::EntityType(&this->_mineType);
  std::vector<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>::vector(&this->_sensorTypes);
  this->_pad3 = '\0';
  std::vector<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>::vector(&this->_mineLocation);
  Pdu::setPduType((Pdu *)this,'\'');
  return;
}

Assistant:

MinefieldDataPdu::MinefieldDataPdu() : MinefieldFamilyPdu(),
   _minefieldID(), 
   _requestingEntityID(), 
   _minefieldSequenceNumbeer(0), 
   _requestID(0), 
   _pduSequenceNumber(0), 
   _numberOfPdus(0), 
   _numberOfMinesInThisPdu(0), 
   _numberOfSensorTypes(0), 
   _pad2(0), 
   _dataFilter(0), 
   _mineType(), 
   _pad3(0)
{
    setPduType( 39 );
}